

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

int parse_args_DCL(Context *ctx)

{
  uint uVar1;
  RegisterType RVar2;
  uint32 uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint32 index_4;
  uint32 usage_4;
  uint32 ttype_2;
  uint32 index_3;
  uint32 usage_3;
  uint32 index_2;
  uint32 usage_2;
  uint32 ttype_1;
  uint32 ttype;
  uint32 index_1;
  uint32 usage_1;
  MiscTypeType mt;
  uint32 index;
  uint32 usage;
  int regnum;
  RegisterType regtype;
  uint32 reserved_mask;
  int reserved1;
  uint32 token;
  int unsupported;
  Context *ctx_local;
  
  bVar7 = false;
  uVar1 = *ctx->tokens;
  regnum = 0;
  if (-1 < (int)uVar1) {
    fail(ctx,"Bit #31 in DCL token must be one");
  }
  ctx->centroid_allowed = 1;
  adjust_token_position(ctx,1);
  parse_destination_token(ctx,&ctx->dest_arg);
  ctx->centroid_allowed = 0;
  if ((ctx->dest_arg).result_shift != 0) {
    fail(ctx,"shift scale in DCL");
  }
  if ((ctx->dest_arg).relative != 0) {
    fail(ctx,"relative addressing in DCL");
  }
  RVar2 = (ctx->dest_arg).regtype;
  uVar3 = (ctx->dest_arg).regnum;
  iVar4 = shader_is_pixel(ctx);
  if ((iVar4 == 0) || (iVar4 = shader_version_atleast(ctx,'\x03','\0'), iVar4 == 0)) {
    iVar4 = shader_is_pixel(ctx);
    if ((iVar4 == 0) || (iVar4 = shader_version_atleast(ctx,'\x02','\0'), iVar4 == 0)) {
      iVar4 = shader_is_vertex(ctx);
      if ((iVar4 == 0) || (iVar4 = shader_version_atleast(ctx,'\x03','\0'), iVar4 == 0)) {
        iVar4 = shader_is_vertex(ctx);
        if ((iVar4 == 0) || (iVar4 = shader_version_atleast(ctx,'\x01','\x01'), iVar4 == 0)) {
          bVar7 = true;
        }
        else {
          bVar7 = RVar2 != REG_TYPE_INPUT;
          if (!bVar7) {
            regnum = 0x7ff0ffe0;
            ctx->dwords[0] = uVar1 & 0xf;
            ctx->dwords[1] = uVar1 >> 0x10 & 0xf;
          }
        }
      }
      else if ((RVar2 == REG_TYPE_INPUT) || (RVar2 == REG_TYPE_OUTPUT)) {
        regnum = 0x7ff0ffe0;
        ctx->dwords[0] = uVar1 & 0xf;
        ctx->dwords[1] = uVar1 >> 0x10 & 0xf;
      }
      else if (RVar2 == REG_TYPE_ADDRESS) {
        uVar5 = uVar1 & 0xf;
        uVar6 = uVar1 >> 0x10 & 0xf;
        if (uVar5 == 5) {
          if (7 < uVar6) {
            fail(ctx,"DCL texcoord usage must have 0-7 index");
          }
        }
        else if (uVar5 == 10) {
          if (uVar6 != 0) {
            fail(ctx,"DCL texcoord usage must have 0 index");
          }
        }
        else {
          fail(ctx,"Invalid DCL texture usage");
        }
        regnum = 0x7ff0ffe0;
        ctx->dwords[0] = uVar5;
        ctx->dwords[1] = uVar6;
      }
      else if (RVar2 == REG_TYPE_SAMPLER) {
        uVar5 = uVar1 >> 0x1b & 0xf;
        iVar4 = valid_texture_type(uVar5);
        if (iVar4 == 0) {
          fail(ctx,"Unknown sampler texture type");
        }
        regnum = 0x6fffffff;
        ctx->dwords[0] = uVar5;
      }
      else {
        bVar7 = true;
      }
    }
    else if (RVar2 == REG_TYPE_INPUT) {
      ctx->dwords[0] = 10;
      ctx->dwords[1] = uVar3;
      regnum = 0x7fffffff;
    }
    else if (RVar2 == REG_TYPE_ADDRESS) {
      ctx->dwords[0] = 5;
      ctx->dwords[1] = uVar3;
      regnum = 0x7fffffff;
    }
    else if (RVar2 == REG_TYPE_SAMPLER) {
      uVar5 = uVar1 >> 0x1b & 0xf;
      iVar4 = valid_texture_type(uVar5);
      if (iVar4 == 0) {
        fail(ctx,"unknown sampler texture type");
      }
      regnum = 0x7ffffff;
      ctx->dwords[0] = uVar5;
    }
    else {
      bVar7 = true;
    }
  }
  else if (RVar2 == REG_TYPE_INPUT) {
    regnum = 0x7ff0ffe0;
    ctx->dwords[0] = uVar1 & 0xf;
    ctx->dwords[1] = uVar1 >> 0x10 & 0xf;
  }
  else if (RVar2 == REG_TYPE_MISCTYPE) {
    if (uVar3 == 0) {
      regnum = 0x7fffffff;
    }
    else if (uVar3 == 1) {
      regnum = 0x7fffffff;
      iVar4 = writemask_xyzw((ctx->dest_arg).orig_writemask);
      if (iVar4 == 0) {
        fail(ctx,"DCL face writemask must be full");
      }
      if ((ctx->dest_arg).result_mod != 0) {
        fail(ctx,"DCL face result modifier must be zero");
      }
      if ((ctx->dest_arg).result_shift != 0) {
        fail(ctx,"DCL face shift scale must be zero");
      }
    }
    else {
      bVar7 = true;
    }
    ctx->dwords[0] = 0xffffffff;
    ctx->dwords[1] = 0;
  }
  else if (RVar2 == REG_TYPE_ADDRESS) {
    uVar5 = uVar1 & 0xf;
    uVar6 = uVar1 >> 0x10 & 0xf;
    if (uVar5 == 5) {
      if (7 < uVar6) {
        fail(ctx,"DCL texcoord usage must have 0-7 index");
      }
    }
    else if (uVar5 == 10) {
      if (uVar6 != 0) {
        fail(ctx,"DCL color usage must have 0 index");
      }
    }
    else {
      fail(ctx,"Invalid DCL texture usage");
    }
    regnum = 0x7ff0ffe0;
    ctx->dwords[0] = uVar5;
    ctx->dwords[1] = uVar6;
  }
  else if (RVar2 == REG_TYPE_SAMPLER) {
    uVar5 = uVar1 >> 0x1b & 0xf;
    iVar4 = valid_texture_type(uVar5);
    if (iVar4 == 0) {
      fail(ctx,"unknown sampler texture type");
    }
    regnum = 0x7ffffff;
    ctx->dwords[0] = uVar5;
  }
  else {
    bVar7 = true;
  }
  if (bVar7) {
    fail(ctx,"invalid DCL register type for this shader model");
  }
  if ((uVar1 & regnum) != 0) {
    fail(ctx,"reserved bits in DCL dword aren\'t zero");
  }
  return 3;
}

Assistant:

static int parse_args_DCL(Context *ctx)
{
    int unsupported = 0;
    const uint32 token = SWAP32(*(ctx->tokens));
    const int reserved1 = (int) ((token >> 31) & 0x1); // bit 31
    uint32 reserved_mask = 0x00000000;

    if (reserved1 != 0x1)
        fail(ctx, "Bit #31 in DCL token must be one");

    ctx->centroid_allowed = 1;
    adjust_token_position(ctx, 1);
    parse_destination_token(ctx, &ctx->dest_arg);
    ctx->centroid_allowed = 0;

    if (ctx->dest_arg.result_shift != 0)  // I'm pretty sure this is illegal...?
        fail(ctx, "shift scale in DCL");
    if (ctx->dest_arg.relative)  // I'm pretty sure this is illegal...?
        fail(ctx, "relative addressing in DCL");

    const RegisterType regtype = ctx->dest_arg.regtype;
    const int regnum = ctx->dest_arg.regnum;
    if ( (shader_is_pixel(ctx)) && (shader_version_atleast(ctx, 3, 0)) )
    {
        if (regtype == REG_TYPE_INPUT)
        {
            const uint32 usage = (token & 0xF);
            const uint32 index = ((token >> 16) & 0xF);
            reserved_mask = 0x7FF0FFE0;
            ctx->dwords[0] = usage;
            ctx->dwords[1] = index;
        } // if

        else if (regtype == REG_TYPE_MISCTYPE)
        {
            const MiscTypeType mt = (MiscTypeType) regnum;
            if (mt == MISCTYPE_TYPE_POSITION)
                reserved_mask = 0x7FFFFFFF;
            else if (mt == MISCTYPE_TYPE_FACE)
            {
                reserved_mask = 0x7FFFFFFF;
                if (!writemask_xyzw(ctx->dest_arg.orig_writemask))
                    fail(ctx, "DCL face writemask must be full");
                if (ctx->dest_arg.result_mod != 0)
                    fail(ctx, "DCL face result modifier must be zero");
                if (ctx->dest_arg.result_shift != 0)
                    fail(ctx, "DCL face shift scale must be zero");
            } // else if
            else
            {
                unsupported = 1;
            } // else

            ctx->dwords[0] = (uint32) MOJOSHADER_USAGE_UNKNOWN;
            ctx->dwords[1] = 0;
        } // else if

        else if (regtype == REG_TYPE_TEXTURE)
        {
            const uint32 usage = (token & 0xF);
            const uint32 index = ((token >> 16) & 0xF);
            if (usage == MOJOSHADER_USAGE_TEXCOORD)
            {
                if (index > 7)
                    fail(ctx, "DCL texcoord usage must have 0-7 index");
            } // if
            else if (usage == MOJOSHADER_USAGE_COLOR)
            {
                if (index != 0)
                    fail(ctx, "DCL color usage must have 0 index");
            } // else if
            else
            {
                fail(ctx, "Invalid DCL texture usage");
            } // else

            reserved_mask = 0x7FF0FFE0;
            ctx->dwords[0] = usage;
            ctx->dwords[1] = index;
        } // else if

        else if (regtype == REG_TYPE_SAMPLER)
        {
            const uint32 ttype = ((token >> 27) & 0xF);
            if (!valid_texture_type(ttype))
                fail(ctx, "unknown sampler texture type");
            reserved_mask = 0x7FFFFFF;
            ctx->dwords[0] = ttype;
        } // else if

        else
        {
            unsupported = 1;
        } // else
    } // if

    else if ( (shader_is_pixel(ctx)) && (shader_version_atleast(ctx, 2, 0)) )
    {
        if (regtype == REG_TYPE_INPUT)
        {
            ctx->dwords[0] = (uint32) MOJOSHADER_USAGE_COLOR;
            ctx->dwords[1] = regnum;
            reserved_mask = 0x7FFFFFFF;
        } // if
        else if (regtype == REG_TYPE_TEXTURE)
        {
            ctx->dwords[0] = (uint32) MOJOSHADER_USAGE_TEXCOORD;
            ctx->dwords[1] = regnum;
            reserved_mask = 0x7FFFFFFF;
        } // else if
        else if (regtype == REG_TYPE_SAMPLER)
        {
            const uint32 ttype = ((token >> 27) & 0xF);
            if (!valid_texture_type(ttype))
                fail(ctx, "unknown sampler texture type");
            reserved_mask = 0x7FFFFFF;
            ctx->dwords[0] = ttype;
        } // else if
        else
        {
            unsupported = 1;
        } // else
    } // if

    else if ( (shader_is_vertex(ctx)) && (shader_version_atleast(ctx, 3, 0)) )
    {
        if ((regtype == REG_TYPE_INPUT) || (regtype == REG_TYPE_OUTPUT))
        {
            const uint32 usage = (token & 0xF);
            const uint32 index = ((token >> 16) & 0xF);
            reserved_mask = 0x7FF0FFE0;
            ctx->dwords[0] = usage;
            ctx->dwords[1] = index;
        } // if
        else if (regtype == REG_TYPE_TEXTURE)
        {
            const uint32 usage = (token & 0xF);
            const uint32 index = ((token >> 16) & 0xF);
            if (usage == MOJOSHADER_USAGE_TEXCOORD)
            {
                if (index > 7)
                    fail(ctx, "DCL texcoord usage must have 0-7 index");
            } // if
            else if (usage == MOJOSHADER_USAGE_COLOR)
            {
                if (index != 0)
                    fail(ctx, "DCL texcoord usage must have 0 index");
            } // else if
            else
                fail(ctx, "Invalid DCL texture usage");

            reserved_mask = 0x7FF0FFE0;
            ctx->dwords[0] = usage;
            ctx->dwords[1] = index;
        } // else if
        else if (regtype == REG_TYPE_SAMPLER)
        {
            const uint32 ttype = ((token >> 27) & 0xF);
            if (!valid_texture_type(ttype))
                fail(ctx, "Unknown sampler texture type");
            reserved_mask = 0x6FFFFFFF;
            ctx->dwords[0] = ttype;
        } // else if
        else
        {
            unsupported = 1;
        } // else
    } // else if

    else if ( (shader_is_vertex(ctx)) && (shader_version_atleast(ctx, 1, 1)) )
    {
        if (regtype == REG_TYPE_INPUT)
        {
            const uint32 usage = (token & 0xF);
            const uint32 index = ((token >> 16) & 0xF);
            reserved_mask = 0x7FF0FFE0;
            ctx->dwords[0] = usage;
            ctx->dwords[1] = index;
        } // if
        else
        {
            unsupported = 1;
        } // else
    } // else if

    else
    {
        unsupported = 1;
    } // else

    if (unsupported)
        fail(ctx, "invalid DCL register type for this shader model");

    if ((token & reserved_mask) != 0)
        fail(ctx, "reserved bits in DCL dword aren't zero");

    return 3;
}